

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependanceestimator.cxx
# Opt level: O3

void __thiscall DependanceEstimator::~DependanceEstimator(DependanceEstimator *this)

{
  int iVar1;
  double **ppdVar2;
  long lVar3;
  
  (this->super_Estimator).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__DependanceEstimator_0015ba48;
  if (this->aSamples != (double *)0x0) {
    operator_delete__(this->aSamples);
  }
  if (this->aOne != (double *)0x0) {
    operator_delete__(this->aOne);
  }
  if (this->aTwo != (double *)0x0) {
    operator_delete__(this->aTwo);
  }
  if (this->aThree != (double *)0x0) {
    operator_delete__(this->aThree);
  }
  ppdVar2 = this->aDist;
  if (ppdVar2 != (double **)0x0) {
    iVar1 = this->dependanceBins;
    if (0 < iVar1) {
      lVar3 = 0;
      do {
        if (this->aDist[lVar3] != (double *)0x0) {
          operator_delete__(this->aDist[lVar3]);
          iVar1 = this->dependanceBins;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < iVar1);
      ppdVar2 = this->aDist;
      if (ppdVar2 == (double **)0x0) goto LAB_0012491f;
    }
    operator_delete__(ppdVar2);
  }
LAB_0012491f:
  Estimator::~Estimator(&this->super_Estimator);
  return;
}

Assistant:

DependanceEstimator::~DependanceEstimator()
{
	if (aSamples)
		delete[] aSamples;
	if (aOne)
		delete[] aOne;
	if (aTwo)
		delete[] aTwo;
	if (aThree)
		delete[] aThree;
	if (aDist) {
		for (int i=0; i<dependanceBins; ++i)
			delete[] aDist[i];
		delete[] aDist;
	}
}